

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chachapoly.c
# Opt level: O2

int mbedtls_chachapoly_starts
              (mbedtls_chachapoly_context *ctx,uchar *nonce,mbedtls_chachapoly_mode_t mode)

{
  int iVar1;
  uchar poly1305_key [64];
  
  iVar1 = mbedtls_chacha20_starts(&ctx->chacha20_ctx,nonce,0);
  if (iVar1 == 0) {
    poly1305_key[0x30] = '\0';
    poly1305_key[0x31] = '\0';
    poly1305_key[0x32] = '\0';
    poly1305_key[0x33] = '\0';
    poly1305_key[0x34] = '\0';
    poly1305_key[0x35] = '\0';
    poly1305_key[0x36] = '\0';
    poly1305_key[0x37] = '\0';
    poly1305_key[0x38] = '\0';
    poly1305_key[0x39] = '\0';
    poly1305_key[0x3a] = '\0';
    poly1305_key[0x3b] = '\0';
    poly1305_key[0x3c] = '\0';
    poly1305_key[0x3d] = '\0';
    poly1305_key[0x3e] = '\0';
    poly1305_key[0x3f] = '\0';
    poly1305_key[0x20] = '\0';
    poly1305_key[0x21] = '\0';
    poly1305_key[0x22] = '\0';
    poly1305_key[0x23] = '\0';
    poly1305_key[0x24] = '\0';
    poly1305_key[0x25] = '\0';
    poly1305_key[0x26] = '\0';
    poly1305_key[0x27] = '\0';
    poly1305_key[0x28] = '\0';
    poly1305_key[0x29] = '\0';
    poly1305_key[0x2a] = '\0';
    poly1305_key[0x2b] = '\0';
    poly1305_key[0x2c] = '\0';
    poly1305_key[0x2d] = '\0';
    poly1305_key[0x2e] = '\0';
    poly1305_key[0x2f] = '\0';
    poly1305_key[0x10] = '\0';
    poly1305_key[0x11] = '\0';
    poly1305_key[0x12] = '\0';
    poly1305_key[0x13] = '\0';
    poly1305_key[0x14] = '\0';
    poly1305_key[0x15] = '\0';
    poly1305_key[0x16] = '\0';
    poly1305_key[0x17] = '\0';
    poly1305_key[0x18] = '\0';
    poly1305_key[0x19] = '\0';
    poly1305_key[0x1a] = '\0';
    poly1305_key[0x1b] = '\0';
    poly1305_key[0x1c] = '\0';
    poly1305_key[0x1d] = '\0';
    poly1305_key[0x1e] = '\0';
    poly1305_key[0x1f] = '\0';
    poly1305_key[0] = '\0';
    poly1305_key[1] = '\0';
    poly1305_key[2] = '\0';
    poly1305_key[3] = '\0';
    poly1305_key[4] = '\0';
    poly1305_key[5] = '\0';
    poly1305_key[6] = '\0';
    poly1305_key[7] = '\0';
    poly1305_key[8] = '\0';
    poly1305_key[9] = '\0';
    poly1305_key[10] = '\0';
    poly1305_key[0xb] = '\0';
    poly1305_key[0xc] = '\0';
    poly1305_key[0xd] = '\0';
    poly1305_key[0xe] = '\0';
    poly1305_key[0xf] = '\0';
    iVar1 = mbedtls_chacha20_update(&ctx->chacha20_ctx,0x40,poly1305_key,poly1305_key);
    if ((iVar1 == 0) &&
       (iVar1 = mbedtls_poly1305_starts(&ctx->poly1305_ctx,poly1305_key), iVar1 == 0)) {
      ctx->aad_len = 0;
      ctx->ciphertext_len = 0;
      ctx->state = 1;
      ctx->mode = mode;
      iVar1 = 0;
    }
  }
  mbedtls_platform_zeroize(poly1305_key,0x40);
  return iVar1;
}

Assistant:

int mbedtls_chachapoly_starts( mbedtls_chachapoly_context *ctx,
                               const unsigned char nonce[12],
                               mbedtls_chachapoly_mode_t mode  )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char poly1305_key[64];
    CHACHAPOLY_VALIDATE_RET( ctx != NULL );
    CHACHAPOLY_VALIDATE_RET( nonce != NULL );

    /* Set counter = 0, will be update to 1 when generating Poly1305 key */
    ret = mbedtls_chacha20_starts( &ctx->chacha20_ctx, nonce, 0U );
    if( ret != 0 )
        goto cleanup;

    /* Generate the Poly1305 key by getting the ChaCha20 keystream output with
     * counter = 0.  This is the same as encrypting a buffer of zeroes.
     * Only the first 256-bits (32 bytes) of the key is used for Poly1305.
     * The other 256 bits are discarded.
     */
    memset( poly1305_key, 0, sizeof( poly1305_key ) );
    ret = mbedtls_chacha20_update( &ctx->chacha20_ctx, sizeof( poly1305_key ),
                                      poly1305_key, poly1305_key );
    if( ret != 0 )
        goto cleanup;

    ret = mbedtls_poly1305_starts( &ctx->poly1305_ctx, poly1305_key );

    if( ret == 0 )
    {
        ctx->aad_len        = 0U;
        ctx->ciphertext_len = 0U;
        ctx->state          = CHACHAPOLY_STATE_AAD;
        ctx->mode           = mode;
    }

cleanup:
    mbedtls_platform_zeroize( poly1305_key, 64U );
    return( ret );
}